

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfConvert.cpp
# Opt level: O0

half Imf_2_5::floatToHalf(float f)

{
  half hVar1;
  bool bVar2;
  undefined6 in_register_00000002;
  float in_XMM0_Da;
  float in_stack_0000000c;
  half *in_stack_00000010;
  unsigned_short local_2;
  
  local_2 = (unsigned_short)((uint6)in_register_00000002 >> 0x20);
  bVar2 = anon_unknown_2::isFinite(in_XMM0_Da);
  if (bVar2) {
    if (65504.0 < in_XMM0_Da) {
      hVar1 = ::half::posInf();
      return (half)hVar1._h;
    }
    if (in_XMM0_Da < -65504.0) {
      hVar1 = ::half::negInf();
      return (half)hVar1._h;
    }
  }
  ::half::half(in_stack_00000010,in_stack_0000000c);
  return (half)local_2;
}

Assistant:

half	
floatToHalf (float f)
{
    if (isFinite (f))
    {
	if (f >  HALF_MAX)
	    return half::posInf();

	if (f < -HALF_MAX)
	    return half::negInf();
    }

    return half (f);
}